

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

void __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::FlatBufferBuilderImpl
          (FlatBufferBuilderImpl<false> *this,size_t initial_size,Allocator *allocator,
          bool own_allocator,size_t buffer_minalign)

{
  uint max_size;
  size_t buffer_minalign_local;
  bool own_allocator_local;
  Allocator *allocator_local;
  size_t initial_size_local;
  FlatBufferBuilderImpl<false> *this_local;
  
  max_size = std::numeric_limits<int>::max();
  vector_downward<unsigned_int>::vector_downward
            (&this->buf_,initial_size,allocator,own_allocator,buffer_minalign,max_size);
  this->num_field_loc = 0;
  this->max_voffset_ = 0;
  this->length_of_64_bit_region_ = 0;
  this->nested = false;
  this->finished = false;
  this->minalign_ = 1;
  this->force_defaults_ = false;
  this->dedup_vtables_ = true;
  this->string_pool = (StringOffsetMap *)0x0;
  EndianCheck();
  return;
}

Assistant:

explicit FlatBufferBuilderImpl(
      size_t initial_size = 1024, Allocator *allocator = nullptr,
      bool own_allocator = false,
      size_t buffer_minalign = AlignOf<largest_scalar_t>())
      : buf_(initial_size, allocator, own_allocator, buffer_minalign,
             static_cast<SizeT>(Is64Aware ? FLATBUFFERS_MAX_64_BUFFER_SIZE
                                          : FLATBUFFERS_MAX_BUFFER_SIZE)),
        num_field_loc(0),
        max_voffset_(0),
        length_of_64_bit_region_(0),
        nested(false),
        finished(false),
        minalign_(1),
        force_defaults_(false),
        dedup_vtables_(true),
        string_pool(nullptr) {
    EndianCheck();
  }